

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool ts_parser__do_all_potential_reductions
                (TSParser *self,StackVersion starting_version,TSSymbol lookahead_symbol)

{
  undefined4 count;
  undefined4 dynamic_precedence;
  undefined2 symbol_00;
  undefined2 alias_sequence_id;
  TSParseAction TVar1;
  ReduceAction new_action;
  bool bVar2;
  uint32_t uVar3;
  _Bool _Var4;
  TSStateId state_00;
  uint32_t uVar5;
  uint32_t uVar6;
  ReduceAction *pRVar7;
  uint32_t local_88;
  TSSymbol TStack_84;
  ReduceAction action_1;
  uint32_t i_3;
  StackVersion reduction_version;
  undefined2 uStack_62;
  undefined2 local_60;
  short sStack_5e;
  byte bStack_5c;
  undefined1 uStack_5b;
  byte bStack_5a;
  TSParseAction action;
  undefined1 auStack_50 [4];
  uint32_t i_2;
  TableEntry entry;
  TSSymbol symbol;
  TSSymbol end_symbol;
  TSSymbol first_symbol;
  _Bool has_shift_action;
  TSStateId state;
  StackVersion i_1;
  uint uStack_28;
  _Bool merged;
  uint32_t version_count;
  uint i;
  StackVersion version;
  _Bool can_shift_lookahead_symbol;
  uint32_t initial_version_count;
  TSSymbol lookahead_symbol_local;
  StackVersion starting_version_local;
  TSParser *self_local;
  
  uVar5 = ts_stack_version_count(self->stack);
  i._3_1_ = false;
  uStack_28 = 0;
  version_count = starting_version;
  do {
    uVar6 = ts_stack_version_count(self->stack);
    if (uVar6 <= version_count) {
      return i._3_1_;
    }
    bVar2 = false;
    for (_end_symbol = uVar5; _end_symbol < version_count; _end_symbol = _end_symbol + 1) {
      _Var4 = ts_stack_merge(self->stack,_end_symbol,version_count);
      if (_Var4) {
        bVar2 = true;
        break;
      }
    }
    uVar3 = version_count;
    if (!bVar2) {
      state_00 = ts_stack_state(self->stack,version_count);
      bVar2 = false;
      (self->reduce_actions).size = 0;
      if (lookahead_symbol == 0) {
        entry._14_2_ = 1;
        entry._12_2_ = SUB42(self->language->token_count,0);
      }
      else {
        entry._12_2_ = lookahead_symbol + 1;
        entry._14_2_ = lookahead_symbol;
      }
      for (entry.action_count._2_2_ = entry._14_2_; entry.action_count._2_2_ < (ushort)entry._12_2_;
          entry.action_count._2_2_ = entry.action_count._2_2_ + 1) {
        ts_language_table_entry
                  (self->language,state_00,entry.action_count._2_2_,(TableEntry *)auStack_50);
        for (action._4_4_ = 0; (uint)action._4_4_ < (uint)entry.actions;
            action._4_4_ = action._4_4_ + 1) {
          TVar1 = _auStack_50[(uint)action._4_4_];
          bStack_5a = TVar1._6_1_;
          if (((ulong)TVar1 & 0xf000000000000) == 0) {
LAB_0013d247:
            sStack_5e._0_1_ = TVar1.params._2_1_;
            if ((((ulong)TVar1 & 0x10000) == 0) && (((byte)sStack_5e >> 1 & 1) == 0)) {
              bVar2 = true;
            }
          }
          else if ((bStack_5a & 0xf) == 1) {
            bStack_5c = TVar1.params._4_1_;
            if (bStack_5c != 0) {
              local_60 = TVar1.params._0_2_;
              sStack_5e = TVar1.params._2_2_;
              uStack_5b = TVar1.params._5_1_;
              new_action.symbol = local_60;
              new_action.count = (uint)bStack_5c;
              new_action._6_2_ = reduction_version._2_2_;
              new_action.dynamic_precedence = (int)sStack_5e;
              new_action.alias_sequence_id._0_1_ = uStack_5b;
              new_action.alias_sequence_id._1_1_ = 0;
              new_action._14_2_ = uStack_62;
              ts_reduce_action_set_add(&self->reduce_actions,new_action);
            }
          }
          else if ((bStack_5a & 0xf) == 3) goto LAB_0013d247;
        }
      }
      action_1.alias_sequence_id = 0xffff;
      action_1._14_2_ = 0xffff;
      for (action_1.dynamic_precedence = 0;
          (uint)action_1.dynamic_precedence < (self->reduce_actions).size;
          action_1.dynamic_precedence = action_1.dynamic_precedence + 1) {
        pRVar7 = (self->reduce_actions).contents + (uint)action_1.dynamic_precedence;
        count = pRVar7->count;
        symbol_00 = pRVar7->symbol;
        dynamic_precedence = pRVar7->dynamic_precedence;
        alias_sequence_id = pRVar7->alias_sequence_id;
        action_1._12_4_ =
             ts_parser__reduce(self,version_count,symbol_00,count,dynamic_precedence,
                               alias_sequence_id,true);
      }
      if (bVar2) {
        i._3_1_ = true;
      }
      else {
        if ((action_1._12_4_ != -1) && (uStack_28 < 6)) {
          ts_stack_renumber_version(self->stack,action_1._12_4_,version_count);
          goto LAB_0013d3a7;
        }
        if (lookahead_symbol != 0) {
          ts_stack_remove_version(self->stack,version_count);
        }
      }
      uVar3 = uVar6;
      if (version_count != starting_version) {
        uVar3 = version_count + 1;
      }
    }
LAB_0013d3a7:
    version_count = uVar3;
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

static bool ts_parser__do_all_potential_reductions(TSParser *self,
                                                   StackVersion starting_version,
                                                   TSSymbol lookahead_symbol) {
  uint32_t initial_version_count = ts_stack_version_count(self->stack);

  bool can_shift_lookahead_symbol = false;
  StackVersion version = starting_version;
  for (unsigned i = 0; true; i++) {
    uint32_t version_count = ts_stack_version_count(self->stack);
    if (version >= version_count) break;

    bool merged = false;
    for (StackVersion i = initial_version_count; i < version; i++) {
      if (ts_stack_merge(self->stack, i, version)) {
        merged = true;
        break;
      }
    }
    if (merged) continue;

    TSStateId state = ts_stack_state(self->stack, version);
    bool has_shift_action = false;
    array_clear(&self->reduce_actions);

    TSSymbol first_symbol, end_symbol;
    if (lookahead_symbol != 0) {
      first_symbol = lookahead_symbol;
      end_symbol = lookahead_symbol + 1;
    } else {
      first_symbol = 1;
      end_symbol = self->language->token_count;
    }

    for (TSSymbol symbol = first_symbol; symbol < end_symbol; symbol++) {
      TableEntry entry;
      ts_language_table_entry(self->language, state, symbol, &entry);
      for (uint32_t i = 0; i < entry.action_count; i++) {
        TSParseAction action = entry.actions[i];
        switch (action.type) {
          case TSParseActionTypeShift:
          case TSParseActionTypeRecover:
            if (!action.params.extra && !action.params.repetition) has_shift_action = true;
            break;
          case TSParseActionTypeReduce:
            if (action.params.child_count > 0)
              ts_reduce_action_set_add(&self->reduce_actions, (ReduceAction){
                .symbol = action.params.symbol,
                .count = action.params.child_count,
                .dynamic_precedence = action.params.dynamic_precedence,
                .alias_sequence_id = action.params.alias_sequence_id,
              });
          default:
            break;
        }
      }
    }

    StackVersion reduction_version = STACK_VERSION_NONE;
    for (uint32_t i = 0; i < self->reduce_actions.size; i++) {
      ReduceAction action = self->reduce_actions.contents[i];

      reduction_version = ts_parser__reduce(
        self, version, action.symbol, action.count,
        action.dynamic_precedence, action.alias_sequence_id,
        true
      );
    }

    if (has_shift_action) {
      can_shift_lookahead_symbol = true;
    } else if (reduction_version != STACK_VERSION_NONE && i < MAX_VERSION_COUNT) {
      ts_stack_renumber_version(self->stack, reduction_version, version);
      continue;
    } else if (lookahead_symbol != 0) {
      ts_stack_remove_version(self->stack, version);
    }

    if (version == starting_version) {
      version = version_count;
    } else {
      version++;
    }
  }

  return can_shift_lookahead_symbol;
}